

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_ElementsAreArrayForward_Test::Body
          (iu_Matcher_x_iutest_x_ElementsAreArrayForward_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  int (*v) [10];
  vector<int,_std::allocator<int>_> *v_00;
  int (*v_01) [3];
  vector<int,_std::allocator<int>_> *container;
  vector<int,_std::allocator<int>_> *v_02;
  AssertionResult *in_R8;
  initializer_list<int> l;
  string local_e00;
  string local_de0;
  AssertionHelper local_dc0;
  Fixed local_d90;
  ElementsAreArrayMatcher<int> local_c08;
  undefined1 local_be0 [8];
  AssertionResult iutest_ar_5;
  string local_b98;
  AssertionHelper local_b78;
  Fixed local_b48;
  undefined4 local_9c0;
  undefined4 local_9bc;
  matchers *local_9b8;
  undefined8 local_9b0;
  ElementsAreArrayMatcher<int> local_9a8;
  undefined1 local_980 [8];
  AssertionResult iutest_ar_4;
  string local_938;
  AssertionHelper local_918;
  Fixed local_8e8;
  ElementsAreArrayMatcher<int> local_760;
  undefined1 local_738 [8];
  AssertionResult iutest_ar_3;
  string local_6f0;
  AssertionHelper local_6d0;
  Fixed local_6a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_518;
  int *local_510;
  matchers *local_508;
  ElementsAreArrayMatcher<int> local_500;
  undefined1 local_4d8 [8];
  AssertionResult iutest_ar_2;
  string local_490;
  AssertionHelper local_470;
  Fixed local_440;
  ElementsAreArrayMatcher<int> local_2b8;
  undefined1 local_290 [8];
  AssertionResult iutest_ar_1;
  string local_248;
  AssertionHelper local_228;
  Fixed local_1f8;
  ElementsAreArrayMatcher<int> local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_ElementsAreArrayForward_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::matchers::ElementsAreArrayForward<int,10ul>
            (&local_60,(matchers *)(anonymous_namespace)::ga,v);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_38,&local_60,
             (vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_60);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              ((string *)&iutest_ar_1.m_result,(iutest *)(anonymous_namespace)::va,v_00);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_248,pdVar2,"ElementsAreArrayForward(ga)",local_38,in_R8);
    in_RCX._M_current = (int *)&local_248;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e1,(string *)in_RCX._M_current,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::matchers::ElementsAreArrayForward<int,3ul>
            (&local_2b8,(matchers *)(anonymous_namespace)::gc,v_01);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_290,&local_2b8,(int (*) [3])(anonymous_namespace)::gc);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_2b8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    memset(&local_440,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_440);
    iutest::PrintToString<int[3]>
              ((string *)&iutest_ar_2.m_result,(int (*) [3])(anonymous_namespace)::gc);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_490,pdVar2,"ElementsAreArrayForward(gc)",local_290,in_R8);
    in_RCX._M_current = (int *)&local_490;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e2,(string *)in_RCX._M_current,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_470,&local_440);
    iutest::AssertionHelper::~AssertionHelper(&local_470);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_440);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  iutest::detail::AlwaysZero();
  local_508 = (matchers *)
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  local_518._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  local_510 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&local_518,1);
  iutest::matchers::
  ElementsAreArrayForward<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&local_500,local_508,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_510,in_RCX);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_4d8,&local_500,(int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_500);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    memset(&local_6a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6a0);
    iutest::PrintToString<int[10]>
              ((string *)&iutest_ar_3.m_result,(int (*) [10])(anonymous_namespace)::ga);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_6f0,pdVar2,"ElementsAreArrayForward(va.begin(), va.begin()+1)",local_4d8,in_R8
              );
    in_RCX._M_current = (int *)&local_6f0;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e3,(string *)in_RCX._M_current,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_6d0,&local_6a0);
    iutest::AssertionHelper::~AssertionHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6a0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  iutest::detail::AlwaysZero();
  iutest::matchers::ElementsAreArrayForward<std::vector<int,std::allocator<int>>>
            (&local_760,(matchers *)(anonymous_namespace)::va,container);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_738,&local_760,
             (vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_760);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    memset(&local_8e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8e8);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              ((string *)&iutest_ar_4.m_result,(iutest *)(anonymous_namespace)::va,v_02);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_938,pdVar2,"ElementsAreArrayForward(va)",local_738,in_R8);
    in_RCX._M_current = (int *)&local_938;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_918,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e4,(string *)in_RCX._M_current,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_918,&local_8e8);
    iutest::AssertionHelper::~AssertionHelper(&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  iutest::detail::AlwaysZero();
  local_9c0 = 1;
  local_9bc = 1;
  local_9b8 = (matchers *)&local_9c0;
  local_9b0 = 2;
  l._M_len = (size_type)in_RCX._M_current;
  l._M_array = (iterator)0x2;
  iutest::matchers::ElementsAreArrayForward<int>(&local_9a8,local_9b8,l);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_980,&local_9a8,(int (*) [3])(anonymous_namespace)::gc);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_9a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    memset(&local_b48,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b48);
    iutest::PrintToString<int[3]>
              ((string *)&iutest_ar_5.m_result,(int (*) [3])(anonymous_namespace)::gc);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_b98,pdVar2,"ElementsAreArrayForward({1, 1})",local_980,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_b78,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e6,&local_b98,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_b78,&local_b48);
    iutest::AssertionHelper::~AssertionHelper(&local_b78);
    std::__cxx11::string::~string((string *)&local_b98);
    std::__cxx11::string::~string((string *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b48);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  iutest::detail::AlwaysZero();
  iutest::matchers::ElementsAreArrayForward<int>(&local_c08,(int *)(anonymous_namespace)::gb,1);
  iutest::detail::ElementsAreArrayMatcher<int>::operator()
            ((AssertionResult *)local_be0,&local_c08,(int (*) [3])(anonymous_namespace)::gc);
  iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher(&local_c08);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    memset(&local_d90,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d90);
    iutest::PrintToString<int[3]>(&local_e00,(int (*) [3])(anonymous_namespace)::gc);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_de0,pdVar2,"ElementsAreArrayForward(gb, 1)",local_be0,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_dc0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x2e8,&local_de0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_dc0,&local_d90);
    iutest::AssertionHelper::~AssertionHelper(&local_dc0);
    std::__cxx11::string::~string((string *)&local_de0);
    std::__cxx11::string::~string((string *)&local_e00);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d90);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  return;
}

Assistant:

IUTEST(Matcher, ElementsAreArrayForward)
{
    IUTEST_EXPECT_THAT(va, ElementsAreArrayForward(ga));
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward(gc));
    IUTEST_EXPECT_THAT(ga, ElementsAreArrayForward(va.begin(), va.begin()+1));
    IUTEST_EXPECT_THAT(va, ElementsAreArrayForward(va));
#if IUTEST_HAS_INITIALIZER_LIST
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward({1, 1}));
#endif
    IUTEST_EXPECT_THAT(gc, ElementsAreArrayForward(gb, 1));
}